

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O0

void __thiscall Array::Array(Array *this,string *name,attr *a)

{
  size_type sVar1;
  reference pvVar2;
  int *in_RDX;
  string *in_RSI;
  long in_RDI;
  int i;
  value_type_conflict *in_stack_ffffffffffffffa8;
  value_type in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar3;
  int local_2c;
  int *local_18;
  
  std::deque<int,_std::allocator<int>_>::deque((deque<int,_std::allocator<int>_> *)0x11c38a);
  std::__cxx11::string::string((string *)(in_RDI + 0x50));
  std::__cxx11::string::operator=((string *)(in_RDI + 0x50),in_RSI);
  for (local_18 = in_RDX; *local_18 == 1; local_18 = (int *)**(undefined8 **)(local_18 + 2)) {
    std::deque<int,_std::allocator<int>_>::push_front
              ((deque<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8);
  }
  if (*local_18 == 0) {
    std::deque<int,_std::allocator<int>_>::push_front
              ((deque<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8);
    local_2c = 1;
    while( true ) {
      iVar3 = local_2c;
      sVar1 = std::deque<int,_std::allocator<int>_>::size
                        ((deque<int,_std::allocator<int>_> *)0x11c46d);
      if ((int)sVar1 <= iVar3) break;
      pvVar2 = std::deque<int,_std::allocator<int>_>::operator[]
                         ((deque<int,_std::allocator<int>_> *)
                          CONCAT44(iVar3,in_stack_ffffffffffffffb0),
                          (size_type)in_stack_ffffffffffffffa8);
      in_stack_ffffffffffffffb0 = *pvVar2;
      pvVar2 = std::deque<int,_std::allocator<int>_>::operator[]
                         ((deque<int,_std::allocator<int>_> *)
                          CONCAT44(iVar3,in_stack_ffffffffffffffb0),
                          (size_type)in_stack_ffffffffffffffa8);
      *pvVar2 = in_stack_ffffffffffffffb0 * *pvVar2;
      local_2c = local_2c + 1;
    }
    return;
  }
  std::operator<<((ostream *)&std::cerr,"Structure not implemented!\n");
  exit(1);
}

Assistant:

Array(const string &name, attr *a) {
        newName = name;
        while (a->kind == ARRAY) {
            directSize.push_front(a->array->size);
            a = a->array->type;
        }
        if (a->kind == BASIC) directSize.push_front(4);
        else { /* TODO Struct */
            IMP_ME("Structure");
        }
        for (int i = 1; i < (int)directSize.size(); ++i)
            directSize[i] *= directSize[i - 1];
    }